

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O1

UriBool uriAppendQueryItemW(UriQueryListW **prevNext,wchar_t *itemCount,wchar_t *keyFirst,
                           wchar_t *keyAfter,wchar_t *valueFirst,wchar_t *valueAfter,
                           UriBool plusToSpace,UriBreakConversion breakConversion,
                           UriMemoryManager *memory)

{
  UriQueryListW *pUVar1;
  wchar_t *inout;
  wchar_t *inout_00;
  long lVar2;
  
  if ((keyAfter < keyFirst || valueAfter < valueFirst) ||
      ((keyAfter == (wchar_t *)0x0 || keyFirst == (wchar_t *)0x0) ||
      (itemCount == (wchar_t *)0x0 || prevNext == (UriQueryListW **)0x0))) {
    return 1;
  }
  if (((valueFirst == (wchar_t *)0x0) && (keyFirst == keyAfter)) && (valueAfter == (wchar_t *)0x0))
  {
    return 1;
  }
  pUVar1 = (UriQueryListW *)(*memory->malloc)(memory,0x18);
  *prevNext = pUVar1;
  if (pUVar1 != (UriQueryListW *)0x0) {
    pUVar1->next = (UriQueryListStructW *)0x0;
    lVar2 = ((long)keyAfter - (long)keyFirst) * 0x40000000;
    inout = (wchar_t *)(*memory->malloc)(memory,lVar2 + 0x100000000 >> 0x1e & 0xfffffffffffffffc);
    if (inout == (wchar_t *)0x0) {
      (*memory->free)(memory,*prevNext);
    }
    else {
      lVar2 = lVar2 >> 0x20;
      inout[lVar2] = L'\0';
      if (0 < (int)((ulong)((long)keyAfter - (long)keyFirst) >> 2)) {
        memcpy(inout,keyFirst,lVar2 << 2);
        uriUnescapeInPlaceExW(inout,plusToSpace,breakConversion);
      }
      (*prevNext)->key = inout;
      if (valueFirst == (wchar_t *)0x0) {
        inout_00 = (wchar_t *)0x0;
LAB_001b7c4d:
        (*prevNext)->value = inout_00;
        *itemCount = *itemCount + L'\x01';
        return 1;
      }
      lVar2 = ((long)valueAfter - (long)valueFirst) * 0x40000000;
      inout_00 = (wchar_t *)
                 (*memory->malloc)(memory,lVar2 + 0x100000000 >> 0x1e & 0xfffffffffffffffc);
      if (inout_00 != (wchar_t *)0x0) {
        lVar2 = lVar2 >> 0x20;
        inout_00[lVar2] = L'\0';
        if (0 < (int)((ulong)((long)valueAfter - (long)valueFirst) >> 2)) {
          memcpy(inout_00,valueFirst,lVar2 << 2);
          uriUnescapeInPlaceExW(inout_00,plusToSpace,breakConversion);
        }
        (*prevNext)->value = inout_00;
        goto LAB_001b7c4d;
      }
      (*memory->free)(memory,inout);
      (*memory->free)(memory,*prevNext);
    }
    *prevNext = (UriQueryListW *)0x0;
  }
  return 0;
}

Assistant:

UriBool URI_FUNC(AppendQueryItem)(URI_TYPE(QueryList) ** prevNext,
		int * itemCount, const URI_CHAR * keyFirst, const URI_CHAR * keyAfter,
		const URI_CHAR * valueFirst, const URI_CHAR * valueAfter,
		UriBool plusToSpace, UriBreakConversion breakConversion,
		UriMemoryManager * memory) {
	const int keyLen = (int)(keyAfter - keyFirst);
	const int valueLen = (int)(valueAfter - valueFirst);
	URI_CHAR * key;
	URI_CHAR * value;

	if ((prevNext == NULL) || (itemCount == NULL)
			|| (keyFirst == NULL) || (keyAfter == NULL)
			|| (keyFirst > keyAfter) || (valueFirst > valueAfter)
			|| ((keyFirst == keyAfter)
				&& (valueFirst == NULL) && (valueAfter == NULL))) {
		return URI_TRUE;
	}

	/* Append new empty item */
	*prevNext = memory->malloc(memory, 1 * sizeof(URI_TYPE(QueryList)));
	if (*prevNext == NULL) {
		return URI_FALSE; /* Raises malloc error */
	}
	(*prevNext)->next = NULL;


	/* Fill key */
	key = memory->malloc(memory, (keyLen + 1) * sizeof(URI_CHAR));
	if (key == NULL) {
		memory->free(memory, *prevNext);
		*prevNext = NULL;
		return URI_FALSE; /* Raises malloc error */
	}

	key[keyLen] = _UT('\0');
	if (keyLen > 0) {
		/* Copy 1:1 */
		memcpy(key, keyFirst, keyLen * sizeof(URI_CHAR));

		/* Unescape */
		URI_FUNC(UnescapeInPlaceEx)(key, plusToSpace, breakConversion);
	}
	(*prevNext)->key = key;


	/* Fill value */
	if (valueFirst != NULL) {
		value = memory->malloc(memory, (valueLen + 1) * sizeof(URI_CHAR));
		if (value == NULL) {
			memory->free(memory, key);
			memory->free(memory, *prevNext);
			*prevNext = NULL;
			return URI_FALSE; /* Raises malloc error */
		}

		value[valueLen] = _UT('\0');
		if (valueLen > 0) {
			/* Copy 1:1 */
			memcpy(value, valueFirst, valueLen * sizeof(URI_CHAR));

			/* Unescape */
			URI_FUNC(UnescapeInPlaceEx)(value, plusToSpace, breakConversion);
		}
		(*prevNext)->value = value;
	} else {
		value = NULL;
	}
	(*prevNext)->value = value;

	(*itemCount)++;
	return URI_TRUE;
}